

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageAlphaClear(Image *image,Color color,float threshold)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_48;
  int local_44;
  int i_4;
  int i_3;
  uchar thresholdValue_3;
  int i_2;
  int iStack_30;
  uchar a_1;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  uchar thresholdValue_2;
  int i_1;
  int iStack_24;
  uchar a;
  uchar b;
  uchar g;
  uchar r;
  uchar thresholdValue_1;
  int i;
  uchar thresholdValue;
  float threshold_local;
  Image *image_local;
  Color color_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (image->format < 0xb) {
      image_local._4_1_ = color.r;
      image_local._5_1_ = color.g;
      image_local._6_1_ = color.b;
      image_local._7_1_ = color.a;
      switch(image->format) {
      case 2:
        for (iStack_24 = 1; iVar1 = image->width * image->height,
            SBORROW4(iStack_24,iVar1 * 2) != iStack_24 + iVar1 * -2 < 0; iStack_24 = iStack_24 + 2)
        {
          if (*(byte *)((long)image->data + (long)iStack_24) <= (byte)(int)(threshold * 255.0)) {
            *(uchar *)((long)image->data + (long)(iStack_24 + -1)) = image_local._4_1_;
            *(byte *)((long)image->data + (long)iStack_24) = image_local._7_1_;
          }
        }
        break;
      default:
        break;
      case 5:
        dVar2 = round((double)((float)((uint)color & 0xff) * 31.0));
        dVar3 = round((double)((float)image_local._5_1_ * 31.0));
        dVar4 = round((double)((float)image_local._6_1_ * 31.0));
        for (iStack_30 = 0; iStack_30 < image->width * image->height; iStack_30 = iStack_30 + 1) {
          if ((*(ushort *)((long)image->data + (long)iStack_30 * 2) & 1) <=
              (ushort)(0.5 <= threshold)) {
            *(ushort *)((long)image->data + (long)iStack_30 * 2) =
                 (ushort)(byte)(int)dVar2 << 0xb | (ushort)(byte)(int)dVar3 << 6 |
                 (ushort)(byte)(int)dVar4 << 1 | (ushort)(0x7f < image_local._7_1_);
          }
        }
        break;
      case 6:
        dVar2 = round((double)((float)((uint)color & 0xff) * 15.0));
        dVar3 = round((double)((float)image_local._5_1_ * 15.0));
        dVar4 = round((double)((float)image_local._6_1_ * 15.0));
        dVar5 = round((double)((float)image_local._7_1_ * 15.0));
        for (i_3 = 0; i_3 < image->width * image->height; i_3 = i_3 + 1) {
          if ((*(ushort *)((long)image->data + (long)i_3 * 2) & 0xf) <=
              (ushort)(byte)(int)(threshold * 15.0)) {
            *(ushort *)((long)image->data + (long)i_3 * 2) =
                 (ushort)(byte)(int)dVar2 << 0xc | (ushort)(byte)(int)dVar3 << 8 |
                 (ushort)(byte)(int)dVar4 << 4 | (ushort)(byte)(int)dVar5;
          }
        }
        break;
      case 7:
        for (local_44 = 3; local_44 < image->width * image->height * 4; local_44 = local_44 + 4) {
          if (*(byte *)((long)image->data + (long)local_44) <= (byte)(int)(threshold * 255.0)) {
            *(uchar *)((long)image->data + (long)(local_44 + -3)) = image_local._4_1_;
            *(byte *)((long)image->data + (long)(local_44 + -2)) = image_local._5_1_;
            *(byte *)((long)image->data + (long)(local_44 + -1)) = image_local._6_1_;
            *(byte *)((long)image->data + (long)local_44) = image_local._7_1_;
          }
        }
        break;
      case 10:
        for (local_48 = 3; local_48 < image->width * image->height * 4; local_48 = local_48 + 4) {
          if (*(float *)((long)image->data + (long)local_48 * 4) <= threshold) {
            *(float *)((long)image->data + (long)(local_48 + -3) * 4) =
                 (float)((uint)color & 0xff) / 255.0;
            *(float *)((long)image->data + (long)(local_48 + -2) * 4) =
                 (float)image_local._5_1_ / 255.0;
            *(float *)((long)image->data + (long)(local_48 + -1) * 4) =
                 (float)image_local._6_1_ / 255.0;
            *(float *)((long)image->data + (long)local_48 * 4) = (float)image_local._7_1_ / 255.0;
          }
        }
      }
    }
    else {
      TraceLog(4,"Image manipulation not supported for compressed formats");
    }
  }
  return;
}

Assistant:

void ImageAlphaClear(Image *image, Color color, float threshold)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        switch (image->format)
        {
            case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*255.0f);
                for (int i = 1; i < image->width*image->height*2; i += 2)
                {
                    if (((unsigned char *)image->data)[i] <= thresholdValue)
                    {
                        ((unsigned char *)image->data)[i - 1] = color.r;
                        ((unsigned char *)image->data)[i] = color.a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
            {
                unsigned char thresholdValue = ((threshold < 0.5f)? 0 : 1);

                unsigned char r = (unsigned char)(round((float)color.r*31.0f));
                unsigned char g = (unsigned char)(round((float)color.g*31.0f));
                unsigned char b = (unsigned char)(round((float)color.b*31.0f));
                unsigned char a = (color.a < 128)? 0 : 1;

                for (int i = 0; i < image->width*image->height; i++)
                {
                    if ((((unsigned short *)image->data)[i] & 0b0000000000000001) <= thresholdValue)
                    {
                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*15.0f);

                unsigned char r = (unsigned char)(round((float)color.r*15.0f));
                unsigned char g = (unsigned char)(round((float)color.g*15.0f));
                unsigned char b = (unsigned char)(round((float)color.b*15.0f));
                unsigned char a = (unsigned char)(round((float)color.a*15.0f));

                for (int i = 0; i < image->width*image->height; i++)
                {
                    if ((((unsigned short *)image->data)[i] & 0x000f) <= thresholdValue)
                    {
                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*255.0f);
                for (int i = 3; i < image->width*image->height*4; i += 4)
                {
                    if (((unsigned char *)image->data)[i] <= thresholdValue)
                    {
                        ((unsigned char *)image->data)[i - 3] = color.r;
                        ((unsigned char *)image->data)[i - 2] = color.g;
                        ((unsigned char *)image->data)[i - 1] = color.b;
                        ((unsigned char *)image->data)[i] = color.a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
            {
                for (int i = 3; i < image->width*image->height*4; i += 4)
                {
                    if (((float *)image->data)[i] <= threshold)
                    {
                        ((float *)image->data)[i - 3] = (float)color.r/255.0f;
                        ((float *)image->data)[i - 2] = (float)color.g/255.0f;
                        ((float *)image->data)[i - 1] = (float)color.b/255.0f;
                        ((float *)image->data)[i] = (float)color.a/255.0f;
                    }
                }
            } break;
            default: break;
        }
    }
}